

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

Curl_easy * Curl_multi_get_handle(Curl_multi *multi,curl_off_t mid)

{
  bool bVar1;
  Curl_llist_node *pCVar2;
  Curl_easy *pCVar3;
  Curl_easy *unaff_R15;
  bool bVar4;
  
  if (mid < 0) {
    return (Curl_easy *)0x0;
  }
  for (pCVar2 = Curl_llist_head(&multi->process); pCVar2 != (Curl_llist_node *)0x0;
      pCVar2 = Curl_node_next(pCVar2)) {
    pCVar3 = (Curl_easy *)Curl_node_elem(pCVar2);
    if (pCVar3->mid == mid) goto LAB_001484ff;
  }
  for (pCVar2 = Curl_llist_head(&multi->msgsent); pCVar2 != (Curl_llist_node *)0x0;
      pCVar2 = Curl_node_next(pCVar2)) {
    pCVar3 = (Curl_easy *)Curl_node_elem(pCVar2);
    if (pCVar3->mid == mid) goto LAB_001484ff;
  }
  pCVar2 = Curl_llist_head(&multi->pending);
  if (pCVar2 == (Curl_llist_node *)0x0) {
    bVar1 = true;
    pCVar3 = unaff_R15;
  }
  else {
    do {
      pCVar3 = (Curl_easy *)Curl_node_elem(pCVar2);
      bVar4 = pCVar3->mid == mid;
      bVar1 = !bVar4;
      if (bVar4) break;
      pCVar2 = Curl_node_next(pCVar2);
    } while (pCVar2 != (Curl_llist_node *)0x0);
  }
LAB_00148509:
  if (bVar1) {
    return (Curl_easy *)0x0;
  }
  return pCVar3;
LAB_001484ff:
  bVar1 = false;
  goto LAB_00148509;
}

Assistant:

struct Curl_easy *Curl_multi_get_handle(struct Curl_multi *multi,
                                        curl_off_t mid)
{

  if(mid >= 0) {
    struct Curl_easy *data;
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in msgsent queue */
    for(e = Curl_llist_head(&multi->msgsent); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in pending queue */
    for(e = Curl_llist_head(&multi->pending); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
  }
  return NULL;
}